

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O0

void __thiscall
mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
          (section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *this,
          string *name)

{
  _Setprecision _Var1;
  ostream *poVar2;
  rep_conflict rVar3;
  double dVar4;
  time_rep mean;
  int rank;
  int p;
  double local_b0;
  time_rep sum;
  double local_80;
  time_rep max;
  comm local_68;
  double local_40;
  time_rep min;
  duration<double,std::ratio<1l,1000l>> local_30 [8];
  rep local_28;
  time_rep elapsed;
  time_point stop;
  string *name_local;
  section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *this_local;
  
  stop.__d.__r = (duration)(duration)name;
  elapsed = (time_rep)std::chrono::_V2::steady_clock::now();
  min = (time_rep)
        std::chrono::operator-
                  ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&elapsed,&this->start);
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (local_30,(duration<long,_std::ratio<1L,_1000000000L>_> *)&min);
  local_28 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count
                       ((duration<double,_std::ratio<1L,_1000L>_> *)local_30);
  mxx::comm::comm(&local_68,&this->comm);
  dVar4 = allreduce<double,mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::end_section(std::__cxx11::string_const&)::_lambda(double,double)_1_>
                    (&local_28,&local_68);
  mxx::comm::~comm(&local_68);
  local_40 = dVar4;
  mxx::comm::comm((comm *)&sum,&this->comm);
  dVar4 = allreduce<double,mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::end_section(std::__cxx11::string_const&)::_lambda(double,double)_2_>
                    (&local_28,(comm *)&sum);
  mxx::comm::~comm((comm *)&sum);
  local_80 = dVar4;
  mxx::comm::comm((comm *)&rank,&this->comm);
  dVar4 = allreduce<double,std::plus<double>>(&local_28,(comm *)&rank);
  mxx::comm::~comm((comm *)&rank);
  local_b0 = dVar4;
  MPI_Comm_rank(this->comm,&mean);
  MPI_Comm_size(this->comm,(long)&mean + 4);
  dVar4 = local_b0 / (double)mean._4_4_;
  if (mean._0_4_ == this->root) {
    poVar2 = this->ostr;
    _Var1 = std::setprecision(3);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::scientific);
    poVar2 = std::operator<<(poVar2,"TIMER");
    poVar2 = std::operator<<(poVar2,(string *)&this->sep);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2,(string *)&this->sep);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    poVar2 = std::operator<<(poVar2,(string *)&this->sep);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_80);
    poVar2 = std::operator<<(poVar2,(string *)&this->sep);
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>
                               ::depth);
    poVar2 = std::operator<<(poVar2,(string *)&this->sep);
    poVar2 = std::operator<<(poVar2,(string *)stop.__d.__r);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  MPI_Barrier(this->comm);
  rVar3 = std::chrono::_V2::steady_clock::now();
  (this->start).__d.__r = rVar3;
  return;
}

Assistant:

void end_section(const std::string& name) {
        std::chrono::steady_clock::time_point stop = std::chrono::steady_clock::now();
        time_rep elapsed = duration(stop-start).count();
        // TODO: reduce rather than allreduce
        // TODO: use single reduction with custom operator
        time_rep min = mxx::allreduce(elapsed, [](time_rep x, time_rep y){return std::min(x,y);}, comm);
        time_rep max = mxx::allreduce(elapsed, [](time_rep x, time_rep y){return std::max(x,y);}, comm);
        time_rep sum = mxx::allreduce(elapsed, std::plus<time_rep>(), comm);
        // calc mean:
        int p, rank;
        MPI_Comm_rank(comm, &rank);
        MPI_Comm_size(comm, &p);
        time_rep mean = sum / (double)p;
        // only root process outputs the timings
        if (rank == root)
            ostr << std::setprecision(3) << std::scientific << "TIMER" << sep << min << sep << mean << sep << max << sep << depth << sep << name << std::endl;
        // restart timer
        MPI_Barrier(comm);
        start = std::chrono::steady_clock::now();
    }